

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-file.c
# Opt level: O3

void file_unlock(ang_file *f)

{
  int __fd;
  undefined4 local_28 [2];
  undefined8 local_20;
  undefined8 uStack_18;
  undefined4 local_10;
  
  local_28[0] = 2;
  local_20 = 0;
  uStack_18 = 0;
  local_10 = 0;
  __fd = fileno((FILE *)f->fh);
  fcntl(__fd,6,local_28);
  return;
}

Assistant:

void file_unlock(ang_file *f)
{
#if defined(HAVE_FCNTL_H) && defined(UNIX)
	struct flock lock;
	lock.l_type = F_UNLCK;
	lock.l_whence = SEEK_SET;
	lock.l_start = 0;
	lock.l_len = 0;
	lock.l_pid = 0;
	fcntl(fileno(f->fh), F_SETLK, &lock);
#endif /* HAVE_FCNTL_H && UNIX */
}